

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::CharSetFull::GetNextRange
          (CharSetFull *this,uint level,Char searchCharStart,Char *outLowerChar,Char *outHigherChar)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 *puVar5;
  Char *outHigherChar_local;
  Char *outLowerChar_local;
  Char searchCharStart_local;
  uint level_local;
  CharSetFull *this_local;
  
  uVar3 = (*(this->super_CharSetNode)._vptr_CharSetNode[0xb])(this,(ulong)level);
  if (uVar3 <= (ushort)searchCharStart) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x146,"(searchCharStart < this->Count(level))",
                       "searchCharStart < this->Count(level)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  *outLowerChar = searchCharStart;
  iVar4 = (*(this->super_CharSetNode)._vptr_CharSetNode[0xb])(this,(ulong)level);
  *outHigherChar = (short)iVar4 + L'\xffff';
  return true;
}

Assistant:

bool CharSetFull::GetNextRange(uint level, Char searchCharStart, _Out_ Char *outLowerChar, _Out_ Char *outHigherChar) const
    {
        Assert(searchCharStart < this->Count(level));

        *outLowerChar = searchCharStart;
        *outHigherChar = (Char)this->Count(level) - 1;

        return true;
    }